

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qauthenticator.cpp
# Opt level: O0

QHash<QByteArray,_QByteArray>
QAuthenticatorPrivate::parseDigestAuthenticationChallenge(QByteArrayView challenge)

{
  QByteArrayView data;
  bool bVar1;
  bool bVar2;
  qsizetype qVar3;
  QHash<QByteArray,_QByteArray> *pQVar4;
  QHash<QByteArray,_QByteArray> *pQVar5;
  QByteArray *this;
  Data *in_RDI;
  long in_FS_OFFSET;
  bool backslash;
  bool quote;
  char *start;
  char *end;
  char *d;
  QByteArray qop;
  QByteArray value;
  QByteArrayView key;
  QHash<QByteArray,_QByteArray> options;
  undefined7 in_stack_fffffffffffffef8;
  char in_stack_fffffffffffffeff;
  uint in_stack_ffffffffffffff00;
  undefined1 in_stack_ffffffffffffff04;
  undefined1 in_stack_ffffffffffffff05;
  undefined1 in_stack_ffffffffffffff06;
  undefined1 in_stack_ffffffffffffff07;
  Data *this_00;
  QHash<QByteArray,_QByteArray> *this_01;
  QHash<QByteArray,_QByteArray> *local_c8;
  QByteArray local_b8;
  QByteArray local_90;
  undefined8 local_78;
  storage_type *psVar6;
  QHash<QByteArray,_QByteArray> local_20;
  QByteArrayView local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_20.d = (Data *)0xaaaaaaaaaaaaaaaa;
  this_00 = in_RDI;
  QHash<QByteArray,_QByteArray>::QHash(&local_20);
  local_c8 = (QHash<QByteArray,_QByteArray> *)QByteArrayView::data(&local_18);
  this_01 = local_c8;
  qVar3 = QByteArrayView::size(&local_18);
  pQVar4 = (QHash<QByteArray,_QByteArray> *)((long)&this_01->d + qVar3);
  for (; local_c8 < pQVar4; local_c8 = (QHash<QByteArray,_QByteArray> *)((long)&local_c8->d + 1)) {
    while( true ) {
      in_stack_ffffffffffffff07 = false;
      if (((local_c8 < pQVar4) &&
          (in_stack_ffffffffffffff06 = true, in_stack_ffffffffffffff07 = in_stack_ffffffffffffff06,
          *(char *)&local_c8->d != ' ')) &&
         (in_stack_ffffffffffffff06 = true, in_stack_ffffffffffffff07 = in_stack_ffffffffffffff06,
         *(char *)&local_c8->d != '\n')) {
        in_stack_ffffffffffffff06 = *(char *)&local_c8->d == '\r';
        in_stack_ffffffffffffff07 = in_stack_ffffffffffffff06;
      }
      if ((bool)in_stack_ffffffffffffff07 == false) break;
      local_c8 = (QHash<QByteArray,_QByteArray> *)((long)&local_c8->d + 1);
    }
    while( true ) {
      in_stack_ffffffffffffff05 = false;
      if (local_c8 < pQVar4) {
        in_stack_ffffffffffffff05 = *(char *)&local_c8->d != '=';
      }
      if ((bool)in_stack_ffffffffffffff05 == false) break;
      local_c8 = (QHash<QByteArray,_QByteArray> *)((long)&local_c8->d + 1);
    }
    QByteArrayView::QByteArrayView<char,_true>
              ((QByteArrayView *)this_00,(char *)in_RDI,
               (ulong)CONCAT16(in_stack_ffffffffffffff06,
                               (uint6)CONCAT14(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00))
              );
    pQVar5 = (QHash<QByteArray,_QByteArray> *)((long)&local_c8->d + 1);
    if (pQVar4 <= pQVar5) break;
    bVar2 = *(char *)&pQVar5->d == '\"';
    if (bVar2) {
      pQVar5 = (QHash<QByteArray,_QByteArray> *)((long)&local_c8->d + 2);
    }
    local_c8 = pQVar5;
    if (pQVar4 <= local_c8) break;
    QByteArray::QByteArray((QByteArray *)0x206779);
    for (; local_c8 < pQVar4; local_c8 = (QHash<QByteArray,_QByteArray> *)((long)&local_c8->d + 1))
    {
      bVar1 = false;
      if ((*(char *)&local_c8->d == '\\') &&
         (local_c8 < (QHash<QByteArray,_QByteArray> *)((long)&pQVar4[-1].d + 7))) {
        local_c8 = (QHash<QByteArray,_QByteArray> *)((long)&local_c8->d + 1);
        bVar1 = true;
      }
      if (!bVar1) {
        if (bVar2) {
          if (*(char *)&local_c8->d == '\"') break;
        }
        else if (*(char *)&local_c8->d == ',') break;
      }
      QByteArray::operator+=
                ((QByteArray *)
                 CONCAT17(in_stack_ffffffffffffff07,
                          CONCAT16(in_stack_ffffffffffffff06,
                                   CONCAT15(in_stack_ffffffffffffff05,
                                            CONCAT14(in_stack_ffffffffffffff04,
                                                     in_stack_ffffffffffffff00)))),
                 in_stack_fffffffffffffeff);
    }
    while( true ) {
      in_stack_ffffffffffffff04 = false;
      if (local_c8 < pQVar4) {
        in_stack_ffffffffffffff04 = *(char *)&local_c8->d != ',';
      }
      if ((bool)in_stack_ffffffffffffff04 == false) break;
      local_c8 = (QHash<QByteArray,_QByteArray> *)((long)&local_c8->d + 1);
    }
    QByteArrayView::toByteArray
              ((QByteArrayView *)
               CONCAT17(in_stack_ffffffffffffff07,
                        CONCAT16(in_stack_ffffffffffffff06,
                                 CONCAT15(in_stack_ffffffffffffff05,(uint5)in_stack_ffffffffffffff00
                                         ))));
    QHash<QByteArray,_QByteArray>::operator[]
              ((QHash<QByteArray,_QByteArray> *)this_00,(QByteArray *)in_RDI);
    QByteArray::operator=
              ((QByteArray *)
               CONCAT17(in_stack_ffffffffffffff07,
                        CONCAT16(in_stack_ffffffffffffff06,
                                 CONCAT15(in_stack_ffffffffffffff05,
                                          CONCAT14(in_stack_ffffffffffffff04,
                                                   in_stack_ffffffffffffff00)))),
               (QByteArray *)CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8));
    QByteArray::~QByteArray((QByteArray *)0x2068b0);
    QByteArray::~QByteArray((QByteArray *)0x2068bd);
  }
  local_78 = 0xaaaaaaaaaaaaaaaa;
  qVar3 = -0x5555555555555556;
  psVar6 = (storage_type *)0xaaaaaaaaaaaaaaaa;
  QByteArray::QByteArray(&local_90,"qop",-1);
  QHash<QByteArray,_QByteArray>::value(this_01,(QByteArray *)this_00);
  QByteArray::~QByteArray((QByteArray *)0x20692b);
  bVar2 = QByteArray::isEmpty((QByteArray *)0x206938);
  if (!bVar2) {
    QByteArrayView::QByteArrayView<QByteArray,_true>((QByteArrayView *)this_00,(QByteArray *)in_RDI)
    ;
    data.m_data = psVar6;
    data.m_size = qVar3;
    bVar2 = containsAuth(data);
    if (!bVar2) {
      memset(in_RDI,0,8);
      QHash<QByteArray,_QByteArray>::QHash((QHash<QByteArray,_QByteArray> *)in_RDI);
      goto LAB_002069e7;
    }
    QByteArray::QByteArray(&local_b8,"qop",-1);
    this = QHash<QByteArray,_QByteArray>::operator[]
                     ((QHash<QByteArray,_QByteArray> *)this_00,(QByteArray *)in_RDI);
    QByteArray::operator=(this,"auth");
    QByteArray::~QByteArray((QByteArray *)0x2069cd);
  }
  QHash<QByteArray,_QByteArray>::QHash
            ((QHash<QByteArray,_QByteArray> *)
             CONCAT17(in_stack_ffffffffffffff07,
                      CONCAT16(in_stack_ffffffffffffff06,
                               CONCAT15(in_stack_ffffffffffffff05,
                                        CONCAT14(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00
                                                )))),
             (QHash<QByteArray,_QByteArray> *)
             CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8));
LAB_002069e7:
  QByteArray::~QByteArray((QByteArray *)0x2069f4);
  QHash<QByteArray,_QByteArray>::~QHash
            ((QHash<QByteArray,_QByteArray> *)
             CONCAT17(in_stack_ffffffffffffff07,
                      CONCAT16(in_stack_ffffffffffffff06,
                               CONCAT15(in_stack_ffffffffffffff05,
                                        CONCAT14(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00
                                                )))));
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QHash<QByteArray,_QByteArray>)this_00;
}

Assistant:

QHash<QByteArray, QByteArray>
QAuthenticatorPrivate::parseDigestAuthenticationChallenge(QByteArrayView challenge)
{
    QHash<QByteArray, QByteArray> options;
    // parse the challenge
    const char *d = challenge.data();
    const char *end = d + challenge.size();
    while (d < end) {
        while (d < end && (*d == ' ' || *d == '\n' || *d == '\r'))
            ++d;
        const char *start = d;
        while (d < end && *d != '=')
            ++d;
        QByteArrayView key = QByteArrayView(start, d - start);
        ++d;
        if (d >= end)
            break;
        bool quote = (*d == '"');
        if (quote)
            ++d;
        if (d >= end)
            break;
        QByteArray value;
        while (d < end) {
            bool backslash = false;
            if (*d == '\\' && d < end - 1) {
                ++d;
                backslash = true;
            }
            if (!backslash) {
                if (quote) {
                    if (*d == '"')
                        break;
                } else {
                    if (*d == ',')
                        break;
                }
            }
            value += *d;
            ++d;
        }
        while (d < end && *d != ',')
            ++d;
        ++d;
        options[key.toByteArray()] = std::move(value);
    }

    QByteArray qop = options.value("qop");
    if (!qop.isEmpty()) {
        if (!containsAuth(qop))
            return QHash<QByteArray, QByteArray>();
        // #### can't do auth-int currently
//         if (qop.contains("auth-int"))
//             qop = "auth-int";
//         else if (qop.contains("auth"))
//             qop = "auth";
//         else
//             qop = QByteArray();
        options["qop"] = "auth";
    }

    return options;
}